

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAS.cpp
# Opt level: O2

void __thiscall Storage::Tape::CAS::CAS(CAS *this,string *file_name)

{
  pointer pCVar1;
  long lVar2;
  size_t in_RCX;
  long lVar3;
  int __fd;
  bool bVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature;
  vector<unsigned_char,_std::allocator<unsigned_char>_> type;
  FileHolder file;
  
  (this->super_Tape).pulse_.length.length = 0;
  (this->super_Tape).pulse_.length.clock_rate = 1;
  (this->super_Tape)._vptr_Tape = (_func_int **)&PTR_is_at_end_0058f320;
  (this->chunks_).
  super__Vector_base<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->chunks_).
  super__Vector_base<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->chunks_).
  super__Vector_base<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->chunk_pointer_ = 0;
  this->phase_ = Header;
  this->distance_into_phase_ = 0;
  this->distance_into_bit_ = 0;
  FileHolder::FileHolder(&file,file_name,ReadWrite);
  do {
    lVar2 = FileHolder::tell(&file);
    __fd = (int)&file;
    FileHolder::read((FileHolder *)&signature,__fd,(void *)0x8,in_RCX);
    bVar4 = true;
    if ((long)signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start == 8) {
      if (*(long *)signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start == 0x747d13ccbadea61f) {
        FileHolder::read((FileHolder *)&type,__fd,(void *)0xa,in_RCX);
        bVar4 = (long)type.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)type.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_start != 10;
        if (!bVar4) {
          bcmp(type.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,(anonymous_namespace)::binary_signature,10);
          bcmp(type.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,(anonymous_namespace)::basic_signature,10);
          bcmp(type.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,(anonymous_namespace)::ascii_signature,10);
          (*(code *)&UNK_003eb193)();
          return;
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&type.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      }
      else {
        pCVar1 = (this->chunks_).
                 super__Vector_base<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((this->chunks_).
            super__Vector_base<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>
            ._M_impl.super__Vector_impl_data._M_start != pCVar1) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    (&pCVar1[-1].data,
                     signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
        }
        for (lVar3 = 1; lVar3 != 8; lVar3 = lVar3 + 1) {
          if (signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[lVar3] == '\x1f') {
            bVar4 = false;
            FileHolder::seek(&file,lVar2 + lVar3,0);
            goto LAB_003eb4a7;
          }
          pCVar1 = (this->chunks_).
                   super__Vector_base<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if ((this->chunks_).
              super__Vector_base<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>
              ._M_impl.super__Vector_impl_data._M_start != pCVar1) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                      (&pCVar1[-1].data,
                       signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar3);
          }
        }
        bVar4 = false;
      }
    }
LAB_003eb4a7:
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (bVar4) {
      FileHolder::~FileHolder(&file);
      return;
    }
  } while( true );
}

Assistant:

CAS::CAS(const std::string &file_name) {
	Storage::FileHolder file(file_name);

	enum class Mode {
		Seeking,
		ASCII,
		Binary,
		BASIC
	} parsing_mode_ = Mode::Seeking;

	while(true) {
		// Churn through the file until the next header signature is found.
		const auto header_position = file.tell();
		const auto signature = file.read(8);
		if(signature.size() != 8) break;
		if(std::memcmp(signature.data(), header_signature, 8)) {
			if(!chunks_.empty()) chunks_.back().data.push_back(signature[0]);

			// Check for other 1fs in this stream, and repeat from there if any.
			for(size_t c = 1; c < 8; ++c) {
				if(signature[c] == 0x1f) {
					file.seek(header_position + long(c), SEEK_SET);
					break;
				} else {
					// Attach any unexpected bytes to the back of the most recent chunk.
					// In effect this creates a linear search for the next explicit tone.
					if(!chunks_.empty()) {
						chunks_.back().data.push_back(signature[c]);
					}
				}
			}
			continue;
		}

		// A header has definitely been found. Require from here at least 16 further bytes,
		// being the type and a name.
		const auto type = file.read(10);
		if(type.size() != 10) break;

		const bool is_binary	= !std::memcmp(type.data(), binary_signature, type.size());
		const bool is_basic		= !std::memcmp(type.data(), basic_signature, type.size());
		const bool is_ascii		= !std::memcmp(type.data(), ascii_signature, type.size());

		switch(parsing_mode_) {
			case Mode::Seeking: {
				if(is_ascii || is_binary || is_basic) {
					file.seek(header_position + 8, SEEK_SET);
					chunks_.emplace_back(!chunks_.empty(), true, file.read(10 + 6));

					if(is_ascii)	parsing_mode_ = Mode::ASCII;
					if(is_binary)	parsing_mode_ = Mode::Binary;
					if(is_basic)	parsing_mode_ = Mode::BASIC;
				} else {
					// Raw data appears now. Grab its length and keep going.
					file.seek(header_position + 8, SEEK_SET);
					const uint16_t length = file.get16le();

					file.seek(header_position + 8, SEEK_SET);
					chunks_.emplace_back(false, false, file.read(size_t(length) + 2));
				}
			} break;

			case Mode::ASCII:
				// Keep reading ASCII in 256-byte segments until a non-ASCII chunk arrives.
				if(is_binary || is_basic || is_ascii) {
					file.seek(header_position, SEEK_SET);
					parsing_mode_ = Mode::Seeking;
				} else {
					file.seek(header_position + 8, SEEK_SET);
					chunks_.emplace_back(false, false, file.read(256));
				}
			break;

			case Mode::Binary: {
				// Get the start and end addresses in order to figure out how much data
				// is here.
				file.seek(header_position + 8, SEEK_SET);
				const uint16_t start_address = file.get16le();
				const uint16_t end_address = file.get16le();

				file.seek(header_position + 8, SEEK_SET);
				const auto length = end_address - start_address + 1;
				chunks_.emplace_back(false, false, file.read(size_t(length) + 6));

				parsing_mode_ = Mode::Seeking;
			} break;

			case Mode::BASIC: {
				// Horror of horrors, this will mean actually following the BASIC
				// linked list of line contents.
				file.seek(header_position + 8, SEEK_SET);
				uint16_t address = 0x8001;	// the BASIC start address.
				while(true) {
					const uint16_t next_line_address = file.get16le();
					if(!next_line_address || file.eof()) break;
					file.seek(next_line_address - address - 2, SEEK_CUR);
					address = next_line_address;
				}
				const auto length = (file.tell() - 1) - (header_position + 8);

				// Create the chunk and return to regular parsing.
				file.seek(header_position + 8, SEEK_SET);
				chunks_.emplace_back(false, false, file.read(size_t(length)));
				parsing_mode_ = Mode::Seeking;
			} break;
		}
	}
}